

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O0

void __thiscall polyscope::RibbonArtist::draw(RibbonArtist *this)

{
  bool bVar1;
  bool *pbVar2;
  element_type *peVar3;
  long in_RDI;
  double dVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  vec3 vVar7;
  vec3 eyePos;
  RibbonArtist *in_stack_000003c0;
  ShaderProgram *in_stack_00000538;
  Structure *in_stack_00000540;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff40;
  allocator *paVar8;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  undefined8 local_28;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_20;
  undefined8 local_18;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_10;
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM0._8_56_;
  pbVar2 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x48));
  if ((*pbVar2 & 1U) != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xf8));
    if (!bVar1) {
      createProgram(in_stack_000003c0);
    }
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_stack_ffffffffffffff40);
    Structure::setTransformUniforms(in_stack_00000540,in_stack_00000538);
    vVar7 = view::getCameraWorldPosition();
    local_20 = vVar7.field_2;
    auVar5._0_8_ = vVar7._0_8_;
    auVar5._8_56_ = auVar6;
    local_28 = vmovlpd_avx(auVar5._0_16_);
    local_18 = local_28;
    local_10 = local_20;
    peVar3 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d9d98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"u_ribbonWidth",&local_49);
    dVar4 = getWidth((RibbonArtist *)0x3d9dd1);
    (*peVar3->_vptr_ShaderProgram[6])(dVar4,peVar3,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    peVar3 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d9e1f);
    paVar8 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"u_depthOffset",paVar8);
    (*peVar3->_vptr_ShaderProgram[6])(0x3f1a36e2eb1c432d,peVar3,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    (**(code **)(*render::engine + 0x50))(render::engine,2);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
    peVar3 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d9eb2);
    (*peVar3->_vptr_ShaderProgram[0x1e])();
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
  }
  return;
}

Assistant:

void RibbonArtist::draw() {

  if (!enabled.get()) {
    return;
  }

  if (!program) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  glm::vec3 eyePos = view::getCameraWorldPosition();

  program->setUniform("u_ribbonWidth", getWidth());
  program->setUniform("u_depthOffset", 1e-4);

  // Draw
  render::engine->setDepthMode(DepthMode::LEqualReadOnly);
  render::engine->setBlendMode(BlendMode::Over);

  program->draw();

  render::engine->setDepthMode();
  render::engine->setBlendMode();
}